

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::imageToJET<float>
               (ImageU8 *ret,Image<float,_gimage::PixelTraits<float>_> *image,double imin,
               double imax)

{
  size_t sVar1;
  bool bVar2;
  uchar uVar3;
  uint uVar4;
  size_t __n;
  long i;
  long i_00;
  long k;
  long k_00;
  work_t wVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (ret,image->width,image->height,3);
  if (imax <= imin) {
    wVar5 = Image<float,_gimage::PixelTraits<float>_>::minValue(image);
    imin = (double)wVar5;
    wVar5 = Image<float,_gimage::PixelTraits<float>_>::maxValue(image);
    imax = (double)wVar5;
  }
  if (imax - imin <= 0.0) {
    sVar1 = ret->n;
    __n = -sVar1;
    if (0 < (long)sVar1) {
      __n = sVar1;
    }
    memset(ret->pixel,0,__n);
    return;
  }
  for (k_00 = 0; k_00 < image->height; k_00 = k_00 + 1) {
    for (i_00 = 0; i_00 < image->width; i_00 = i_00 + 1) {
      bVar2 = Image<float,_gimage::PixelTraits<float>_>::isValid(image,i_00,k_00);
      if (bVar2) {
        dVar6 = (((double)(*image->img)[k_00][i_00] - imin) / (imax - imin)) / 1.15 + 0.1;
        dVar9 = ABS(dVar6 + -0.75) * -4.0 + 1.5;
        if (1.0 <= dVar9) {
          dVar9 = 1.0;
        }
        auVar7._0_8_ = ABS(dVar6 + -0.25) * -4.0 + 1.5;
        auVar7._8_8_ = ABS(dVar6 + -0.5) * -4.0 + 1.5;
        auVar8 = minpd(auVar7,_DAT_00148150);
        dVar6 = auVar8._0_8_;
        dVar10 = auVar8._8_8_;
        auVar8._8_8_ = -(ulong)(0.0 < dVar10);
        auVar8._0_8_ = -(ulong)(0.0 < dVar6);
        uVar4 = movmskpd((int)(*image->img)[k_00],auVar8);
        if ((uVar4 & 2) == 0) {
          dVar10 = 0.0;
        }
        if ((uVar4 & 1) == 0) {
          dVar6 = 0.0;
        }
        if (dVar9 <= 0.0) {
          dVar9 = 0.0;
        }
        (*ret->img)[k_00][i_00] = (uchar)(int)(dVar9 * 255.0 + 0.5);
        ret->img[1][k_00][i_00] = (uchar)(int)(dVar10 * 255.0 + 0.5);
        uVar3 = (uchar)(int)(dVar6 * 255.0 + 0.5);
      }
      else {
        uVar3 = '\0';
        (*ret->img)[k_00][i_00] = '\0';
        ret->img[1][k_00][i_00] = '\0';
      }
      ret->img[2][k_00][i_00] = uVar3;
    }
  }
  return;
}

Assistant:

void imageToJET(ImageU8 &ret, const Image<T> &image, double imin=0, double imax=-1)
{
  ret.setSize(image.getWidth(), image.getHeight(), 3);

  if (imax <= imin)
  {
    imin=image.minValue();
    imax=image.maxValue();
  }

  double irange=imax-imin;

  if (irange <= 0)
  {
    ret.clear();
    return;
  }

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        double v=image.get(i, k, 0);

        v=(v-imin)/irange;
        v=v/1.15+0.1;

        double r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
        double g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
        double b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));

        ret.set(i, k, 0, static_cast<unsigned char>(255*r+0.5));
        ret.set(i, k, 1, static_cast<unsigned char>(255*g+0.5));
        ret.set(i, k, 2, static_cast<unsigned char>(255*b+0.5));
      }
      else
      {
        ret.set(i, k, 0, 0);
        ret.set(i, k, 1, 0);
        ret.set(i, k, 2, 0);
      }
    }
  }
}